

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O2

void __thiscall RandomizerWorld::load_teleport_trees(RandomizerWorld *this)

{
  bool bVar1;
  reference this_00;
  const_reference pvVar2;
  WorldTeleportTree *pWVar3;
  Json trees_json;
  pair<WorldTeleportTree_*,_WorldTeleportTree_*> local_a8;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  iterator __end1;
  iterator __begin1;
  
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = 0;
  uStack_80 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[1918]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&trees_json,
             (uchar (*) [1918])
             "[\n    [\n        {\n            \"name\": \"Massan tree\",\n            \"treeMapId\": 512,\n            \"nodeId\": \"route_massan_gumi\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 2 }\n        },\n        {\n            \"name\": \"Tibor tree\",\n            \"treeMapId\": 534,\n            \"nodeId\": \"route_gumi_ryuma\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 3 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Mercator front gate tree\",\n            \"treeMapId\": 539,\n            \"nodeId\": \"route_gumi_ryuma\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 5 }\n        },\n        {\n            \"name\": \"Verla shore tree\",\n            \"treeMapId\": 537,\n            \"nodeId\": \"verla_shore\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 4 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Destel sector tree\",\n            \"treeMapId\": 536,\n            \"nodeId\": \"route_after_destel\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 7 }\n        },\n        {\n            \"name\": \"Lake Shrine sector tree\",\n            \"treeMapId\": 513,\n            \"nodeId\": \"route_lake_shrine\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 6 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Mir Tower sector tree\",\n            \"treeMapId\": 538,\n            \"nodeId\": \"mir_tower_sector\",\n            \"flag\": { \"byte\": \"0x25\", \"bit\": 1 }\n        },\n        {\n            \"name\": \"Mountainous area tree\",\n            \"treeMapId\": 535,\n            \"nodeId\": \"mountainous_area\",\n            \"flag\": { \"byte\": \"0x25\", \"bit\": 0 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Greenmaze entrance tree\",\n            \"treeMapId\": 510,\n            \"nodeId\": \"greenmaze_pre_whistle\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 0 }\n        },\n        {\n            \"name\": \"Greenmaze end tree\",\n            \"treeMapId\": 511,\n            \"nodeId\": \"greenmaze_post_whistle\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 1 }\n        }\n    ]\n]"
             ,(parser_callback_t *)&local_98,true,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin(&__begin1,&trees_json);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end(&__end1,&trees_json);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&__begin1,&__end1);
    if (!bVar1) break;
    this_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&__begin1);
    pvVar2 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](this_00,0);
    pWVar3 = WorldTeleportTree::from_json(pvVar2);
    pvVar2 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](this_00,1);
    local_a8.second = WorldTeleportTree::from_json(pvVar2);
    pWVar3->_paired_map_id = (local_a8.second)->_map_id;
    (local_a8.second)->_paired_map_id = pWVar3->_map_id;
    local_a8.first = pWVar3;
    std::
    vector<std::pair<WorldTeleportTree*,WorldTeleportTree*>,std::allocator<std::pair<WorldTeleportTree*,WorldTeleportTree*>>>
    ::emplace_back<std::pair<WorldTeleportTree*,WorldTeleportTree*>>
              ((vector<std::pair<WorldTeleportTree*,WorldTeleportTree*>,std::allocator<std::pair<WorldTeleportTree*,WorldTeleportTree*>>>
                *)&this->_teleport_tree_pairs,&local_a8);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&__begin1);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&trees_json);
  return;
}

Assistant:

void RandomizerWorld::load_teleport_trees()
{
    Json trees_json = Json::parse(WORLD_TELEPORT_TREES_JSON);
    for(const Json& tree_pair_json : trees_json)
    {
        WorldTeleportTree* tree_1 = WorldTeleportTree::from_json(tree_pair_json[0]);
        WorldTeleportTree* tree_2 = WorldTeleportTree::from_json(tree_pair_json[1]);
        tree_1->paired_map_id(tree_2->map_id());
        tree_2->paired_map_id(tree_1->map_id());
        _teleport_tree_pairs.emplace_back(std::make_pair(tree_1, tree_2));
    }
}